

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperVec.c
# Opt level: O0

void Map_NodeVecPush(Map_NodeVec_t *p,Map_Node_t *Entry)

{
  int iVar1;
  Map_Node_t *Entry_local;
  Map_NodeVec_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Map_NodeVecGrow(p,0x10);
    }
    else {
      Map_NodeVecGrow(p,p->nCap << 1);
    }
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

void Map_NodeVecPush( Map_NodeVec_t * p, Map_Node_t * Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Map_NodeVecGrow( p, 16 );
        else
            Map_NodeVecGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}